

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.h
# Opt level: O2

NestedTestInt * __thiscall
proto2_unittest::TestMessageSetExtension3::_internal_mutable_msg(TestMessageSetExtension3 *this)

{
  NestedTestInt *pNVar1;
  Arena *arena;
  
  pNVar1 = (this->field_0)._impl_.msg_;
  if (pNVar1 != (NestedTestInt *)0x0) {
    return pNVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pNVar1 = (NestedTestInt *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::NestedTestInt>(arena);
  (this->field_0)._impl_.msg_ = pNVar1;
  return pNVar1;
}

Assistant:

inline ::proto2_unittest::NestedTestInt* PROTOBUF_NONNULL TestMessageSetExtension3::_internal_mutable_msg() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.msg_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::NestedTestInt>(GetArena());
    _impl_.msg_ = reinterpret_cast<::proto2_unittest::NestedTestInt*>(p);
  }
  return _impl_.msg_;
}